

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

uint32_t virtio_tx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  uint *puVar1;
  long *plVar2;
  uint *puVar3;
  undefined8 *puVar4;
  uint in_ECX;
  long in_RDX;
  long in_RDI;
  vring_desc *desc_1;
  pkt_buf *buf;
  uint16_t idx;
  uint32_t buf_idx;
  vring_desc *desc;
  vring_used_elem *e;
  virtqueue *vq;
  ixy_device *__mptr;
  virtio_device *dev;
  uint16_t in_stack_ffffffffffffff7e;
  virtio_device *in_stack_ffffffffffffff80;
  ushort local_56;
  uint local_54;
  
  puVar1 = *(uint **)(in_RDI + 0x80);
  while ((short)puVar1[10] != *(short *)(*(long *)(puVar1 + 6) + 2)) {
    puVar3 = (uint *)(*(long *)(puVar1 + 6) + 4 + ((ulong)(ushort)puVar1[10] % (ulong)*puVar1) * 8);
    puVar4 = (undefined8 *)(*(long *)(puVar1 + 2) + (ulong)*puVar3 * 0x10);
    *puVar4 = 0;
    *(undefined4 *)(puVar4 + 1) = 0;
    pkt_buf_free(*(pkt_buf **)(puVar1 + (ulong)*puVar3 * 2 + 0xe));
    *(short *)(puVar1 + 10) = (short)puVar1[10] + 1;
  }
  local_56 = 0;
  for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
    plVar2 = *(long **)(in_RDX + (ulong)local_54 * 8);
    while (((uint)local_56 < *puVar1 &&
           (*(long *)(*(long *)(puVar1 + 2) + (ulong)local_56 * 0x10) != 0))) {
      local_56 = local_56 + 1;
    }
    if ((uint)local_56 == *puVar1) break;
    *(ulong *)(in_RDI + 0xa8) = (ulong)*(uint *)((long)plVar2 + 0x14) + *(long *)(in_RDI + 0xa8);
    *(long *)(in_RDI + 0x98) = *(long *)(in_RDI + 0x98) + 1;
    *(long **)(puVar1 + (ulong)local_56 * 2 + 0xe) = plVar2;
    *(undefined8 *)((long)plVar2 + 0x36) = 0x2a0000;
    *(undefined2 *)((long)plVar2 + 0x3e) = 0;
    *(int *)(*(long *)(puVar1 + 2) + (ulong)local_56 * 0x10 + 8) =
         *(int *)((long)plVar2 + 0x14) + 10;
    *(long *)(*(long *)(puVar1 + 2) + (ulong)local_56 * 0x10) = *plVar2 + 0x36;
    *(undefined2 *)(*(long *)(puVar1 + 2) + (ulong)local_56 * 0x10 + 0xc) = 0;
    *(undefined2 *)(*(long *)(puVar1 + 2) + (ulong)local_56 * 0x10 + 0xe) = 0;
    in_stack_ffffffffffffff80 = *(virtio_device **)(puVar1 + 4);
    *(ushort *)
     ((long)&(in_stack_ffffffffffffff80->ixy).pci_addr +
     ((ulong)(*(ushort *)(*(long *)(puVar1 + 4) + 2) + local_54) % (ulong)*puVar1) * 2 + 4) =
         local_56;
  }
  *(short *)(*(long *)(puVar1 + 4) + 2) = *(short *)(*(long *)(puVar1 + 4) + 2) + (short)local_54;
  virtio_legacy_notify_queue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  return local_54;
}

Assistant:

uint32_t virtio_tx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->tx_queue;

	_mm_mfence();
	// Free sent buffers
	while (vq->vq_used_last_idx != vq->vring.used->idx) {
		// info("We can free some buffers: %u != %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("e %p, id %u", e, e->id);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		desc->addr = 0;
		desc->len = 0;
		pkt_buf_free(vq->virtual_addresses[e->id]);
		vq->vq_used_last_idx++;
		_mm_mfence();
	}
	// Send buffers
	uint32_t buf_idx;
	uint16_t idx = 0; // Keep index of last found free descriptor and start searching from there
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		struct pkt_buf* buf = bufs[buf_idx];
		// Find free desc index
		for (; idx < vq->vring.num; ++idx) {
			struct vring_desc* desc = &vq->vring.desc[idx];
			if (desc->addr == 0) {
				break;
			}
		}
		if (idx == vq->vring.num) {
			break;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);

		// Update tx counter
		dev->tx_bytes += buf->size;
		dev->tx_pkts++;

		vq->virtual_addresses[idx] = buf;

		// Copy header to headroom in front of data buffer
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));

		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = 0;
		vq->vring.desc[idx].next = 0;
		vq->vring.avail->ring[(vq->vring.avail->idx + buf_idx) % vq->vring.num] = idx;
	}
	_mm_mfence();
	vq->vring.avail->idx += buf_idx;
	_mm_mfence();
	virtio_legacy_notify_queue(dev, 1);
	return buf_idx;
}